

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

int Curl_FormInit(Form *form,FormData *formdata)

{
  FormData *formdata_local;
  Form *form_local;
  
  if (formdata != (FormData *)0x0) {
    form->data = formdata;
    form->sent = 0;
    form->fp = (FILE *)0x0;
    form->fread_func = (curl_read_callback)0x0;
  }
  form_local._4_4_ = (uint)(formdata == (FormData *)0x0);
  return form_local._4_4_;
}

Assistant:

int Curl_FormInit(struct Form *form, struct FormData *formdata)
{
  if(!formdata)
    return 1; /* error */

  form->data = formdata;
  form->sent = 0;
  form->fp = NULL;
  form->fread_func = ZERO_NULL;

  return 0;
}